

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsaz_exp.c
# Opt level: O0

void RSAZ_1024_mod_exp_avx2
               (unsigned_long *result_norm,unsigned_long *base_norm,unsigned_long *exponent,
               unsigned_long *m_norm,unsigned_long *RR,unsigned_long k0)

{
  long lVar1;
  undefined1 *puVar2;
  int iVar3;
  undefined8 in_RCX;
  int iVar4;
  byte *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int wvalue;
  int index;
  uchar *R2;
  uchar *table_s;
  uchar *result;
  uchar *m;
  uchar *a_inv;
  uchar *p_str;
  uchar storage [5632];
  int local_166c;
  undefined1 *local_1658;
  undefined1 *local_1650;
  undefined1 *local_1648;
  undefined1 local_1638 [64];
  undefined1 auStack_15f8 [320];
  undefined1 auStack_14b8 [320];
  undefined1 auStack_1378 [320];
  undefined1 auStack_1238 [4616];
  undefined8 local_30;
  undefined8 local_28;
  byte *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_1650 = auStack_15f8 + -((ulong)local_1638 & 0x3f);
  puVar2 = local_1650 + 0x3c0;
  if (((ulong)local_1650 & 0xfff) + 0x140 >> 0xc == 0) {
    local_1658 = local_1650 + 0x140;
    local_1648 = local_1650 + 0x280;
  }
  else {
    local_1648 = local_1650 + 0x140;
    local_1658 = local_1650;
    local_1650 = local_1650 + 0x280;
  }
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  rsaz_1024_norm2red_avx2(local_1650,in_RCX);
  rsaz_1024_norm2red_avx2(local_1648,local_10);
  rsaz_1024_norm2red_avx2(puVar2,local_28);
  rsaz_1024_mul_avx2(puVar2,puVar2,puVar2,local_1650,local_30);
  rsaz_1024_mul_avx2(puVar2,puVar2,two80,local_1650,local_30);
  rsaz_1024_mul_avx2(local_1658,puVar2,one,local_1650,local_30);
  rsaz_1024_mul_avx2(local_1648,local_1648,puVar2,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0);
  rsaz_1024_scatter5_avx2(puVar2,local_1648,1);
  rsaz_1024_sqr_avx2(local_1658,local_1648,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,2);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,4);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,8);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x10);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x11);
  rsaz_1024_gather5_avx2(local_1658,puVar2,2);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,3);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,6);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0xc);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x18);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x19);
  rsaz_1024_gather5_avx2(local_1658,puVar2,4);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,5);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,10);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x14);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x15);
  rsaz_1024_gather5_avx2(local_1658,puVar2,6);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,7);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0xe);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1c);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1d);
  rsaz_1024_gather5_avx2(local_1658,puVar2,8);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,9);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x12);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x13);
  rsaz_1024_gather5_avx2(local_1658,puVar2,10);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0xb);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x16);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x17);
  rsaz_1024_gather5_avx2(local_1658,puVar2,0xc);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0xd);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1a);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1b);
  rsaz_1024_gather5_avx2(local_1658,puVar2,0xe);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0xf);
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,1);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1e);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_scatter5_avx2(puVar2,local_1658,0x1f);
  rsaz_1024_gather5_avx2(local_1658,puVar2,(int)(uint)local_18[0x7f] >> 3);
  local_166c = 0x3f6;
  while (-1 < local_166c) {
    rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,5);
    iVar3 = local_166c / 8;
    iVar4 = local_166c / 8;
    lVar1 = (long)local_166c;
    local_166c = local_166c + -5;
    rsaz_1024_gather5_avx2
              (local_1648,puVar2,
               (int)(uint)CONCAT11(local_18[iVar3 + 1],local_18[iVar4]) >>
               ((byte)(lVar1 % 8) & 0x1f) & 0x1f);
    rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  }
  rsaz_1024_sqr_avx2(local_1658,local_1658,local_1650,local_30,4);
  rsaz_1024_gather5_avx2(local_1648,puVar2,*local_18 & 0xf);
  rsaz_1024_mul_avx2(local_1658,local_1658,local_1648,local_1650,local_30);
  rsaz_1024_mul_avx2(local_1658,local_1658,one,local_1650,local_30);
  rsaz_1024_red2norm_avx2(local_8,local_1658);
  OPENSSL_cleanse(local_1638,0x1600);
  return;
}

Assistant:

void RSAZ_1024_mod_exp_avx2(BN_ULONG result_norm[16],
                            const BN_ULONG base_norm[16],
                            const BN_ULONG exponent[16],
                            const BN_ULONG m_norm[16], const BN_ULONG RR[16],
                            BN_ULONG k0)
{
    unsigned char storage[320 * 3 + 32 * 9 * 16 + 64]; /* 5.5KB */
    unsigned char *p_str = storage + (64 - ((size_t)storage % 64));
    unsigned char *a_inv, *m, *result;
    unsigned char *table_s = p_str + 320 * 3;
    unsigned char *R2 = table_s; /* borrow */
    int index;
    int wvalue;

    if ((((size_t)p_str & 4095) + 320) >> 12) {
        result = p_str;
        a_inv = p_str + 320;
        m = p_str + 320 * 2;    /* should not cross page */
    } else {
        m = p_str;              /* should not cross page */
        result = p_str + 320;
        a_inv = p_str + 320 * 2;
    }

    rsaz_1024_norm2red_avx2(m, m_norm);
    rsaz_1024_norm2red_avx2(a_inv, base_norm);
    rsaz_1024_norm2red_avx2(R2, RR);

    rsaz_1024_mul_avx2(R2, R2, R2, m, k0);
    rsaz_1024_mul_avx2(R2, R2, two80, m, k0);

    /* table[0] = 1 */
    rsaz_1024_mul_avx2(result, R2, one, m, k0);
    /* table[1] = a_inv^1 */
    rsaz_1024_mul_avx2(a_inv, a_inv, R2, m, k0);

    rsaz_1024_scatter5_avx2(table_s, result, 0);
    rsaz_1024_scatter5_avx2(table_s, a_inv, 1);

    /* table[2] = a_inv^2 */
    rsaz_1024_sqr_avx2(result, a_inv, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 2);
#if 0
    /* this is almost 2x smaller and less than 1% slower */
    for (index = 3; index < 32; index++) {
        rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
        rsaz_1024_scatter5_avx2(table_s, result, index);
    }
#else
    /* table[4] = a_inv^4 */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 4);
    /* table[8] = a_inv^8 */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 8);
    /* table[16] = a_inv^16 */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 16);
    /* table[17] = a_inv^17 */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 17);

    /* table[3] */
    rsaz_1024_gather5_avx2(result, table_s, 2);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 3);
    /* table[6] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 6);
    /* table[12] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 12);
    /* table[24] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 24);
    /* table[25] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 25);

    /* table[5] */
    rsaz_1024_gather5_avx2(result, table_s, 4);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 5);
    /* table[10] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 10);
    /* table[20] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 20);
    /* table[21] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 21);

    /* table[7] */
    rsaz_1024_gather5_avx2(result, table_s, 6);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 7);
    /* table[14] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 14);
    /* table[28] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 28);
    /* table[29] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 29);

    /* table[9] */
    rsaz_1024_gather5_avx2(result, table_s, 8);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 9);
    /* table[18] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 18);
    /* table[19] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 19);

    /* table[11] */
    rsaz_1024_gather5_avx2(result, table_s, 10);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 11);
    /* table[22] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 22);
    /* table[23] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 23);

    /* table[13] */
    rsaz_1024_gather5_avx2(result, table_s, 12);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 13);
    /* table[26] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 26);
    /* table[27] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 27);

    /* table[15] */
    rsaz_1024_gather5_avx2(result, table_s, 14);
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 15);
    /* table[30] */
    rsaz_1024_sqr_avx2(result, result, m, k0, 1);
    rsaz_1024_scatter5_avx2(table_s, result, 30);
    /* table[31] */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    rsaz_1024_scatter5_avx2(table_s, result, 31);
#endif

    /* load first window */
    p_str = (unsigned char *)exponent;
    wvalue = p_str[127] >> 3;
    rsaz_1024_gather5_avx2(result, table_s, wvalue);

    index = 1014;

    while (index > -1) {        /* loop for the remaining 127 windows */

        rsaz_1024_sqr_avx2(result, result, m, k0, 5);

        wvalue = (p_str[(index / 8) + 1] << 8) | p_str[index / 8];
        wvalue = (wvalue >> (index % 8)) & 31;
        index -= 5;

        rsaz_1024_gather5_avx2(a_inv, table_s, wvalue); /* borrow a_inv */
        rsaz_1024_mul_avx2(result, result, a_inv, m, k0);
    }

    /* square four times */
    rsaz_1024_sqr_avx2(result, result, m, k0, 4);

    wvalue = p_str[0] & 15;

    rsaz_1024_gather5_avx2(a_inv, table_s, wvalue); /* borrow a_inv */
    rsaz_1024_mul_avx2(result, result, a_inv, m, k0);

    /* from Montgomery */
    rsaz_1024_mul_avx2(result, result, one, m, k0);

    rsaz_1024_red2norm_avx2(result_norm, result);

    OPENSSL_cleanse(storage, sizeof(storage));
}